

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

uint32 __thiscall rw::Texture::streamGetSizeNative(Texture *this)

{
  Texture *this_local;
  
  if (this->raster->platform == 4) {
    this_local._4_4_ = ps2::getSizeNativeTexture(this);
  }
  else if (this->raster->platform == 8) {
    this_local._4_4_ = d3d8::getSizeNativeTexture(this);
  }
  else if (this->raster->platform == 9) {
    this_local._4_4_ = d3d9::getSizeNativeTexture(this);
  }
  else if (this->raster->platform == 5) {
    this_local._4_4_ = xbox::getSizeNativeTexture(this);
  }
  else if (this->raster->platform == 0xc) {
    this_local._4_4_ = gl3::getSizeNativeTexture(this);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32
Texture::streamGetSizeNative(void)
{
	if(this->raster->platform == PLATFORM_PS2)
		return ps2::getSizeNativeTexture(this);
	if(this->raster->platform == PLATFORM_D3D8)
		return d3d8::getSizeNativeTexture(this);
	if(this->raster->platform == PLATFORM_D3D9)
		return d3d9::getSizeNativeTexture(this);
	if(this->raster->platform == PLATFORM_XBOX)
		return xbox::getSizeNativeTexture(this);
	if(this->raster->platform == PLATFORM_GL3)
		return gl3::getSizeNativeTexture(this);
	assert(0 && "unsupported platform");
	return 0;
}